

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_group_id_from_group(mbedtls_ecp_group *grp,mbedtls_ecp_group_id *grp_id)

{
  int iVar1;
  int iVar2;
  mbedtls_ecp_group_id *local_120;
  mbedtls_ecp_group_id *id;
  mbedtls_ecp_group ref;
  int ret;
  mbedtls_ecp_group_id *grp_id_local;
  mbedtls_ecp_group *grp_local;
  
  ref.T_size._4_4_ = 0;
  mbedtls_ecp_group_init((mbedtls_ecp_group *)&id);
  for (local_120 = mbedtls_ecp_grp_id_list(); *local_120 != MBEDTLS_ECP_DP_NONE;
      local_120 = local_120 + 1) {
    mbedtls_ecp_group_free((mbedtls_ecp_group *)&id);
    ref.T_size._4_4_ = mbedtls_ecp_group_load((mbedtls_ecp_group *)&id,*local_120);
    if (ref.T_size._4_4_ != 0) break;
    if ((((((mbedtls_mpi_uint *)grp->pbits == ref.N.p) && (grp->nbits == ref.pbits)) &&
         (iVar1 = mbedtls_mpi_cmp_mpi(&grp->P,(mbedtls_mpi *)&ref), iVar1 == 0)) &&
        ((iVar1 = mbedtls_mpi_cmp_mpi(&grp->A,(mbedtls_mpi *)&ref.P.p), iVar1 == 0 &&
         (iVar1 = mbedtls_mpi_cmp_mpi(&grp->B,(mbedtls_mpi *)&ref.A.p), iVar1 == 0)))) &&
       ((iVar1 = mbedtls_mpi_cmp_mpi(&grp->N,(mbedtls_mpi *)&ref.G.Z.p), iVar1 == 0 &&
        ((iVar1 = mbedtls_mpi_cmp_mpi(&(grp->G).X,(mbedtls_mpi *)&ref.B.p), iVar1 == 0 &&
         (iVar1 = mbedtls_mpi_cmp_mpi(&(grp->G).Z,(mbedtls_mpi *)&ref.G.Y.p), iVar1 == 0)))))) {
      iVar1 = mbedtls_mpi_get_bit(&(grp->G).Y,0);
      iVar2 = mbedtls_mpi_get_bit((mbedtls_mpi *)&ref.G.X.p,0);
      if (iVar1 == iVar2) break;
    }
  }
  mbedtls_ecp_group_free((mbedtls_ecp_group *)&id);
  *grp_id = *local_120;
  if ((ref.T_size._4_4_ == 0) && (*local_120 == MBEDTLS_ECP_DP_NONE)) {
    ref.T_size._4_4_ = -0x4e80;
  }
  return ref.T_size._4_4_;
}

Assistant:

static int pk_group_id_from_group( const mbedtls_ecp_group *grp, mbedtls_ecp_group_id *grp_id )
{
    int ret = 0;
    mbedtls_ecp_group ref;
    const mbedtls_ecp_group_id *id;

    mbedtls_ecp_group_init( &ref );

    for( id = mbedtls_ecp_grp_id_list(); *id != MBEDTLS_ECP_DP_NONE; id++ )
    {
        /* Load the group associated to that id */
        mbedtls_ecp_group_free( &ref );
        MBEDTLS_MPI_CHK( mbedtls_ecp_group_load( &ref, *id ) );

        /* Compare to the group we were given, starting with easy tests */
        if( grp->pbits == ref.pbits && grp->nbits == ref.nbits &&
            mbedtls_mpi_cmp_mpi( &grp->P, &ref.P ) == 0 &&
            mbedtls_mpi_cmp_mpi( &grp->A, &ref.A ) == 0 &&
            mbedtls_mpi_cmp_mpi( &grp->B, &ref.B ) == 0 &&
            mbedtls_mpi_cmp_mpi( &grp->N, &ref.N ) == 0 &&
            mbedtls_mpi_cmp_mpi( &grp->G.X, &ref.G.X ) == 0 &&
            mbedtls_mpi_cmp_mpi( &grp->G.Z, &ref.G.Z ) == 0 &&
            /* For Y we may only know the parity bit, so compare only that */
            mbedtls_mpi_get_bit( &grp->G.Y, 0 ) == mbedtls_mpi_get_bit( &ref.G.Y, 0 ) )
        {
            break;
        }

    }

cleanup:
    mbedtls_ecp_group_free( &ref );

    *grp_id = *id;

    if( ret == 0 && *id == MBEDTLS_ECP_DP_NONE )
        ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;

    return( ret );
}